

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcapi_psbt.cpp
# Opt level: O3

int CfdAddPsbtTxOutWithPubkey
              (void *handle,void *psbt_handle,int64_t amount,char *locking_script,char *descriptor,
              uint32_t *index)

{
  Psbt *this;
  Psbt *this_00;
  ByteData **ppBVar1;
  bool bVar2;
  uint32_t uVar3;
  CfdException *pCVar4;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  path_args;
  Script script;
  string err_msg;
  DescriptorScriptReference ref;
  Descriptor desc;
  KeyData key;
  undefined1 local_828 [32];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_808;
  Script local_7e8;
  undefined1 local_7b0 [32];
  undefined1 local_790 [16];
  pointer local_780;
  pointer local_768;
  pointer local_750;
  TapBranch local_738;
  vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_> local_6c0;
  Script local_6a8;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_668;
  DescriptorScriptReference local_638;
  DescriptorNode local_2e8;
  KeyData local_180;
  
  cfd::Initialize();
  ppBVar1 = (ByteData **)&local_638.locking_script_.script_data_;
  local_638._0_8_ = ppBVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_638,"PsbtHandle","");
  cfd::capi::CheckBuffer(psbt_handle,(string *)&local_638);
  if ((ByteData **)local_638._0_8_ != ppBVar1) {
    operator_delete((void *)local_638._0_8_);
  }
  if (*(long *)((long)psbt_handle + 0x18) != 0) {
    cfd::core::Script::Script(&local_7e8);
    bVar2 = cfd::capi::IsEmptyString(locking_script);
    if (!bVar2) {
      std::__cxx11::string::string((string *)local_7b0,locking_script,(allocator *)&local_2e8);
      cfd::core::Script::Script((Script *)&local_638,(string *)local_7b0);
      cfd::core::Script::operator=(&local_7e8,(Script *)&local_638);
      cfd::core::Script::~Script((Script *)&local_638);
      if ((undefined1 *)local_7b0._0_8_ != local_7b0 + 0x10) {
        operator_delete((void *)local_7b0._0_8_);
      }
    }
    bVar2 = cfd::capi::IsEmptyString(descriptor);
    if (bVar2) {
      bVar2 = cfd::core::Script::IsEmpty(&local_7e8);
      if (bVar2) {
        local_638._0_8_ = "cfdcapi_psbt.cpp";
        local_638.locking_script_._vptr_Script._0_4_ = 0x51a;
        local_638.locking_script_.script_data_.data_.
        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start = "CfdAddPsbtTxOutWithPubkey";
        cfd::core::logger::log<>
                  ((CfdSourceLocation *)&local_638,kCfdLogLevelWarning,
                   "locking_script is null or empty.");
        pCVar4 = (CfdException *)__cxa_allocate_exception(0x30);
        local_638._0_8_ = ppBVar1;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_638,"Failed to parameter. locking_script is null or empty.","");
        cfd::core::CfdException::CfdException(pCVar4,kCfdIllegalArgumentError,(string *)&local_638);
        __cxa_throw(pCVar4,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException
                   );
      }
      this = *(Psbt **)((long)psbt_handle + 0x18);
      cfd::core::Amount::Amount((Amount *)&local_638,amount);
      uVar3 = cfd::core::Psbt::AddTxOut(this,&local_7e8,(Amount *)&local_638);
    }
    else {
      std::__cxx11::string::string((string *)&local_638,descriptor,(allocator *)local_7b0);
      cfd::core::Descriptor::Parse
                ((Descriptor *)&local_2e8,(string *)&local_638,
                 (vector<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>
                  *)0x0);
      if ((ByteData **)local_638._0_8_ != ppBVar1) {
        operator_delete((void *)local_638._0_8_);
      }
      local_808.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_808.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      local_808.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      cfd::core::Descriptor::GetKeyData(&local_180,(Descriptor *)&local_2e8,&local_808);
      cfd::core::Descriptor::GetReference(&local_638,(Descriptor *)&local_2e8,&local_808);
      bVar2 = cfd::core::Script::IsEmpty(&local_7e8);
      if (!bVar2) {
        cfd::core::DescriptorScriptReference::GetLockingScript((Script *)local_7b0,&local_638);
        bVar2 = cfd::core::Script::Equals(&local_7e8,(Script *)local_7b0);
        cfd::core::Script::~Script((Script *)local_7b0);
        if (!bVar2) {
          local_7b0._0_8_ = local_7b0 + 0x10;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_7b0,"locking_script doesn\'t match the descriptor.","");
          local_828._0_8_ = "cfdcapi_psbt.cpp";
          local_828._8_4_ = 0x50f;
          local_828._16_8_ = "CfdAddPsbtTxOutWithPubkey";
          cfd::core::logger::log<std::__cxx11::string&>
                    ((CfdSourceLocation *)local_828,kCfdLogLevelWarning,"{}",
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_7b0)
          ;
          pCVar4 = (CfdException *)__cxa_allocate_exception(0x30);
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_828,"Failed to parameter. ",
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_7b0);
          cfd::core::CfdException::CfdException(pCVar4,kCfdIllegalArgumentError,(string *)local_828)
          ;
          __cxa_throw(pCVar4,&cfd::core::CfdException::typeinfo,
                      cfd::core::CfdException::~CfdException);
        }
      }
      this_00 = *(Psbt **)((long)psbt_handle + 0x18);
      cfd::core::Amount::Amount((Amount *)local_828,amount);
      cfd::core::DescriptorScriptReference::GenerateAddress
                ((Address *)local_7b0,&local_638,*(NetType *)((long)psbt_handle + 0x10));
      uVar3 = cfd::Psbt::AddTxOutData(this_00,(Amount *)local_828,(Address *)local_7b0,&local_180);
      std::
      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::~_Rb_tree(&local_668);
      cfd::core::Script::~Script(&local_6a8);
      local_738._vptr_TapBranch = (_func_int **)&PTR__TaprootScriptTree_0072eb30;
      std::vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>::~vector
                (&local_6c0);
      cfd::core::TapBranch::~TapBranch(&local_738);
      if (local_750 != (pointer)0x0) {
        operator_delete(local_750);
      }
      if (local_768 != (pointer)0x0) {
        operator_delete(local_768);
      }
      if (local_780 != (pointer)0x0) {
        operator_delete(local_780);
      }
      if ((undefined1 *)local_7b0._16_8_ != local_790) {
        operator_delete((void *)local_7b0._16_8_);
      }
      cfd::core::DescriptorScriptReference::~DescriptorScriptReference(&local_638);
      cfd::core::KeyData::~KeyData(&local_180);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&local_808);
      cfd::core::DescriptorNode::~DescriptorNode(&local_2e8);
    }
    if (index != (uint32_t *)0x0) {
      *index = uVar3;
    }
    cfd::core::Script::~Script(&local_7e8);
    return 0;
  }
  local_638._0_8_ = "cfdcapi_psbt.cpp";
  local_638.locking_script_._vptr_Script._0_4_ = 0x4fc;
  local_638.locking_script_.script_data_.data_.
  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.super__Vector_impl_data.
  _M_start = "CfdAddPsbtTxOutWithPubkey";
  cfd::core::logger::log<>((CfdSourceLocation *)&local_638,kCfdLogLevelWarning,"psbt is null.");
  pCVar4 = (CfdException *)__cxa_allocate_exception(0x30);
  local_638._0_8_ = ppBVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_638,"Failed to handle statement. psbt is null.","");
  cfd::core::CfdException::CfdException(pCVar4,kCfdIllegalStateError,(string *)&local_638);
  __cxa_throw(pCVar4,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
}

Assistant:

int CfdAddPsbtTxOutWithPubkey(
    void* handle, void* psbt_handle, int64_t amount,
    const char* locking_script, const char* descriptor, uint32_t* index) {
  int result = CfdErrorCode::kCfdUnknownError;
  try {
    cfd::Initialize();
    CheckBuffer(psbt_handle, kPrefixPsbtHandle);
    CfdCapiPsbtHandle* psbt_obj = static_cast<CfdCapiPsbtHandle*>(psbt_handle);
    if (psbt_obj->psbt == nullptr) {
      warn(CFD_LOG_SOURCE, "psbt is null.");
      throw CfdException(
          CfdError::kCfdIllegalStateError,
          "Failed to handle statement. psbt is null.");
    }

    Script script;
    uint32_t txout_index = 0;
    if (!IsEmptyString(locking_script)) {
      script = Script(locking_script);
    }

    if (!IsEmptyString(descriptor)) {
      Descriptor desc = Descriptor::Parse(descriptor);
      std::vector<std::string> path_args;
      auto key = desc.GetKeyData(path_args);
      auto ref = desc.GetReference(&path_args);
      if ((!script.IsEmpty()) && (!script.Equals(ref.GetLockingScript()))) {
        std::string err_msg = "locking_script doesn't match the descriptor.";
        warn(CFD_LOG_SOURCE, "{}", err_msg);
        throw CfdException(
            CfdError::kCfdIllegalArgumentError,
            "Failed to parameter. " + err_msg);
      }

      txout_index = psbt_obj->psbt->AddTxOutData(
          Amount(amount), ref.GenerateAddress(psbt_obj->net_type), key);
    } else if (!script.IsEmpty()) {
      txout_index = psbt_obj->psbt->AddTxOut(script, Amount(amount));
    } else {
      warn(CFD_LOG_SOURCE, "locking_script is null or empty.");
      throw CfdException(
          CfdError::kCfdIllegalArgumentError,
          "Failed to parameter. locking_script is null or empty.");
    }

    if (index != nullptr) *index = txout_index;
    return CfdErrorCode::kCfdSuccess;
  } catch (const CfdException& except) {
    result = SetLastError(handle, except);
  } catch (const std::exception& std_except) {
    SetLastFatalError(handle, std_except.what());
  } catch (...) {
    SetLastFatalError(handle, "unknown error.");
  }
  return result;
}